

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputmethod.cpp
# Opt level: O1

void __thiscall QInputMethod::setInputItemTransform(QInputMethod *this,QTransform *transform)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QTransform *pQVar4;
  QTransform *this_00;
  byte bVar5;
  
  bVar5 = 0;
  lVar1 = *(long *)&this->field_0x8;
  this_00 = (QTransform *)(lVar1 + 0x78);
  bVar2 = QTransform::operator==(this_00,transform);
  if (bVar2) {
    return;
  }
  pQVar4 = transform;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    this_00->m_matrix[0][0] = pQVar4->m_matrix[0][0];
    pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    this_00 = (QTransform *)((long)this_00 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  *(undefined2 *)(lVar1 + 0xc0) = *(undefined2 *)&transform->field_0x48;
  QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)0x0);
  QMetaObject::activate(&this->super_QObject,&staticMetaObject,1,(void **)0x0);
  return;
}

Assistant:

void QInputMethod::setInputItemTransform(const QTransform &transform)
{
    Q_D(QInputMethod);
    if (d->inputItemTransform == transform)
        return;

    d->inputItemTransform = transform;
    emit cursorRectangleChanged();
    emit anchorRectangleChanged();
}